

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderLineStrip<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLogLog>
               (GetterXsYs<unsigned_long_long> *getter,TransformerLogLog *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ImVec2 IVar7;
  ImPlotPlot *pIVar8;
  double dVar9;
  double dVar10;
  ImPlotContext *pIVar11;
  ImPlotContext *pIVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  ImPlotContext *gp;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  TransformerLogLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar11 = GImPlot;
  pIVar8 = GImPlot->CurrentPlot;
  if (((pIVar8->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar14 = getter->Count;
    local_48 = iVar14 + -1;
    lVar13 = (long)((getter->Offset % iVar14 + iVar14) % iVar14) * (long)getter->Stride;
    uVar2 = *(unsigned_long_long *)((long)getter->Xs + lVar13);
    auVar24._8_4_ = (int)(uVar2 >> 0x20);
    auVar24._0_8_ = uVar2;
    auVar24._12_4_ = 0x45300000;
    uVar3 = *(unsigned_long_long *)((long)getter->Ys + lVar13);
    auVar25._8_4_ = (int)(uVar3 >> 0x20);
    auVar25._0_8_ = uVar3;
    auVar25._12_4_ = 0x45300000;
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    dVar9 = log10(((auVar24._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                  (pIVar8->XAxis).Range.Min);
    pIVar8 = pIVar11->CurrentPlot;
    dVar4 = pIVar11->LogDenX;
    dVar5 = (pIVar8->XAxis).Range.Min;
    dVar6 = (pIVar8->XAxis).Range.Max;
    dVar10 = log10(((auVar25._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                   pIVar8->YAxis[transformer->YAxis].Range.Min);
    iVar14 = transformer->YAxis;
    pIVar8 = pIVar11->CurrentPlot;
    auVar26._8_8_ = dVar10;
    auVar26._0_8_ = dVar9;
    auVar30._8_8_ = pIVar11->LogDenY[iVar14];
    auVar30._0_8_ = dVar4;
    auVar20 = divpd(auVar26,auVar30);
    dVar4 = pIVar8->YAxis[iVar14].Range.Min;
    IVar7 = pIVar11->PixelRange[iVar14].Min;
    local_3c.y = (float)(pIVar11->My[iVar14] *
                         (((double)(float)auVar20._8_8_ * (pIVar8->YAxis[iVar14].Range.Max - dVar4)
                          + dVar4) - dVar4) + (double)IVar7.y);
    local_3c.x = (float)(pIVar11->Mx *
                         (((double)(float)auVar20._0_8_ * (dVar6 - dVar5) + dVar5) -
                         (pIVar8->XAxis).Range.Min) + (double)IVar7.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLogLog>>
              ((LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLogLog>
                *)local_58,DrawList,&pIVar8->PlotRect);
  }
  else {
    iVar14 = getter->Count;
    lVar13 = (long)((getter->Offset % iVar14 + iVar14) % iVar14) * (long)getter->Stride;
    uVar2 = *(unsigned_long_long *)((long)getter->Xs + lVar13);
    auVar20._8_4_ = (int)(uVar2 >> 0x20);
    auVar20._0_8_ = uVar2;
    auVar20._12_4_ = 0x45300000;
    uVar3 = *(unsigned_long_long *)((long)getter->Ys + lVar13);
    auVar18._8_4_ = (int)(uVar3 >> 0x20);
    auVar18._0_8_ = uVar3;
    auVar18._12_4_ = 0x45300000;
    dVar9 = log10(((auVar20._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                  (pIVar8->XAxis).Range.Min);
    pIVar8 = pIVar11->CurrentPlot;
    dVar4 = pIVar11->LogDenX;
    dVar5 = (pIVar8->XAxis).Range.Min;
    dVar6 = (pIVar8->XAxis).Range.Max;
    dVar10 = log10(((auVar18._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                   pIVar8->YAxis[transformer->YAxis].Range.Min);
    iVar14 = transformer->YAxis;
    pIVar8 = pIVar11->CurrentPlot;
    auVar28._8_8_ = pIVar11->LogDenY[iVar14];
    auVar28._0_8_ = dVar4;
    auVar19._8_8_ = dVar10;
    auVar19._0_8_ = dVar9;
    auVar20 = divpd(auVar19,auVar28);
    dVar4 = pIVar8->YAxis[iVar14].Range.Min;
    IVar7 = pIVar11->PixelRange[iVar14].Min;
    local_58._4_4_ =
         (float)(pIVar11->My[iVar14] *
                 (((double)(float)auVar20._8_8_ * (pIVar8->YAxis[iVar14].Range.Max - dVar4) + dVar4)
                 - dVar4) + (double)IVar7.y);
    local_58._0_4_ =
         (float)(pIVar11->Mx *
                 (((double)(float)auVar20._0_8_ * (dVar6 - dVar5) + dVar5) -
                 (pIVar8->XAxis).Range.Min) + (double)IVar7.x);
    iVar14 = getter->Count;
    if (1 < iVar14) {
      iVar15 = 1;
      do {
        pIVar12 = GImPlot;
        lVar13 = (long)(((getter->Offset + iVar15) % iVar14 + iVar14) % iVar14) *
                 (long)getter->Stride;
        uVar2 = *(unsigned_long_long *)((long)getter->Xs + lVar13);
        auVar21._8_4_ = (int)(uVar2 >> 0x20);
        auVar21._0_8_ = uVar2;
        auVar21._12_4_ = 0x45300000;
        uVar3 = *(unsigned_long_long *)((long)getter->Ys + lVar13);
        auVar22._8_4_ = (int)(uVar3 >> 0x20);
        auVar22._0_8_ = uVar3;
        auVar22._12_4_ = 0x45300000;
        dVar9 = log10(((auVar21._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar8 = pIVar12->CurrentPlot;
        dVar4 = pIVar12->LogDenX;
        dVar5 = (pIVar8->XAxis).Range.Min;
        dVar6 = (pIVar8->XAxis).Range.Max;
        dVar10 = log10(((auVar22._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                       pIVar8->YAxis[transformer->YAxis].Range.Min);
        iVar14 = transformer->YAxis;
        pIVar8 = pIVar12->CurrentPlot;
        auVar23._8_8_ = dVar10;
        auVar23._0_8_ = dVar9;
        auVar29._8_8_ = pIVar12->LogDenY[iVar14];
        auVar29._0_8_ = dVar4;
        auVar20 = divpd(auVar23,auVar29);
        dVar4 = pIVar8->YAxis[iVar14].Range.Min;
        IVar7 = pIVar12->PixelRange[iVar14].Min;
        fVar16 = (float)(pIVar12->Mx *
                         (((double)(float)auVar20._0_8_ * (dVar6 - dVar5) + dVar5) -
                         (pIVar8->XAxis).Range.Min) + (double)IVar7.x);
        fVar17 = (float)(pIVar12->My[iVar14] *
                         (((double)(float)auVar20._8_8_ * (pIVar8->YAxis[iVar14].Range.Max - dVar4)
                          + dVar4) - dVar4) + (double)IVar7.y);
        local_60.y = fVar17;
        local_60.x = fVar16;
        pIVar8 = pIVar11->CurrentPlot;
        fVar27 = (float)local_58._4_4_;
        if (fVar17 <= (float)local_58._4_4_) {
          fVar27 = fVar17;
        }
        if ((fVar27 < (pIVar8->PlotRect).Max.y) &&
           (fVar27 = (float)(~-(uint)(fVar17 <= (float)local_58._4_4_) & (uint)fVar17 |
                            local_58._4_4_ & -(uint)(fVar17 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar8->PlotRect).Min.y, *pfVar1 <= fVar27 && fVar27 != *pfVar1)) {
          fVar27 = (float)local_58._0_4_;
          if (fVar16 <= (float)local_58._0_4_) {
            fVar27 = fVar16;
          }
          if ((fVar27 < (pIVar8->PlotRect).Max.x) &&
             (fVar27 = (float)(-(uint)(fVar16 <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(fVar16 <= (float)local_58._0_4_) & (uint)fVar16),
             (pIVar8->PlotRect).Min.x <= fVar27 && fVar27 != (pIVar8->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar15 = iVar15 + 1;
        iVar14 = getter->Count;
        local_58 = (undefined1  [8])local_60;
      } while (iVar15 < iVar14);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}